

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall
clickhouse::SocketHolder::SetTcpKeepAlive(SocketHolder *this,int idle,int intvl,int cnt)

{
  int val;
  int cnt_local;
  int intvl_local;
  int idle_local;
  
  val = 1;
  cnt_local = cnt;
  intvl_local = intvl;
  idle_local = idle;
  setsockopt(this->handle_,1,9,&val,4);
  setsockopt(this->handle_,6,4,&idle_local,4);
  setsockopt(this->handle_,6,5,&intvl_local,4);
  setsockopt(this->handle_,6,6,&cnt_local,4);
  return;
}

Assistant:

void SocketHolder::SetTcpKeepAlive(int idle, int intvl, int cnt) noexcept {
    int val = 1;
    
#if defined(_unix_)
    setsockopt(handle_, SOL_SOCKET, SO_KEEPALIVE, &val, sizeof(val));
#   if defined(_linux_)
        setsockopt(handle_, IPPROTO_TCP, TCP_KEEPIDLE, &idle, sizeof(idle));
#   elif defined(_darwin_)
        setsockopt(handle_, IPPROTO_TCP, TCP_KEEPALIVE, &idle, sizeof(idle));
#   else
#       error "platform does not supported"
#   endif
    setsockopt(handle_, IPPROTO_TCP, TCP_KEEPINTVL, &intvl, sizeof(intvl));
    setsockopt(handle_, IPPROTO_TCP, TCP_KEEPCNT, &cnt, sizeof(cnt));
#else
    setsockopt(handle_, SOL_SOCKET, SO_KEEPALIVE, (const char*)&val, sizeof(val));
    std::ignore = idle = intvl = cnt;
#endif
}